

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<kj::_::XThreadEvent_*> * __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent_*>::operator=
          (ArrayBuilder<kj::_::XThreadEvent_*> *this,ArrayBuilder<kj::_::XThreadEvent_*> *other)

{
  XThreadEvent **ppXVar1;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar2;
  XThreadEvent **ppXVar3;
  ArrayDisposer *pAVar4;
  
  ppXVar1 = this->ptr;
  if (ppXVar1 != (XThreadEvent **)0x0) {
    ppXVar2 = this->pos;
    ppXVar3 = this->endPtr;
    this->ptr = (XThreadEvent **)0x0;
    this->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    this->endPtr = (XThreadEvent **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppXVar1,8,(long)ppXVar2 - (long)ppXVar1 >> 3,
               (long)ppXVar3 - (long)ppXVar1 >> 3,0);
  }
  ppXVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppXVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (XThreadEvent **)0x0;
  other->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  other->endPtr = (XThreadEvent **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }